

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

void ssh_sent(Plug *plug,size_t bufsize)

{
  PlugVtable *pPVar1;
  code *UNRECOVERED_JUMPTABLE;
  size_t sVar2;
  undefined8 extraout_RDX;
  
  if (bufsize < 0x8000) {
    if (*(char *)&plug[0x17].vt != '\0') {
      *(undefined1 *)&plug[0x17].vt = 0;
      plug[0x16].vt = (PlugVtable *)bufsize;
      (**(code **)((plug[0x34].vt)->closing + 0x90))(plug[0x34].vt,0);
    }
    queue_idempotent_callback((IdempotentCallback *)(plug + 0x29));
    pPVar1 = plug[-4].vt;
    sVar2 = ssh_sendbuffer((Backend *)(plug + 1));
    UNRECOVERED_JUMPTABLE = *(code **)(pPVar1->log + 0x10);
    (*UNRECOVERED_JUMPTABLE)(pPVar1,sVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

static void ssh_sent(Plug *plug, size_t bufsize)
{
    Ssh *ssh = container_of(plug, Ssh, plug);
    /*
     * If the send backlog on the SSH socket itself clears, we should
     * unthrottle the whole world if it was throttled. Also trigger an
     * extra call to the consumer of the BPP's output, to try to send
     * some more data off its bufchain.
     */
    if (bufsize < SSH_MAX_BACKLOG) {
        ssh_throttle_all(ssh, false, bufsize);
        queue_idempotent_callback(&ssh->ic_out_raw);
        ssh_sendbuffer_changed(ssh);
    }
}